

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstate.c
# Opt level: O1

lua_State * lua_newthread(lua_State *L)

{
  lua_State *L1;
  int iVar1;
  global_State *pgVar2;
  StkId pTVar3;
  long lVar4;
  int *piVar5;
  undefined8 uVar6;
  undefined8 *puVar7;
  
  iVar1 = **(int **)&L[-1].hookmask;
  **(int **)&L[-1].hookmask = iVar1 + 1;
  if (iVar1 != 0) {
    __assert_fail("(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock)++ == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lstate.c"
                  ,0x11b,"lua_State *lua_newthread(lua_State *)");
  }
  pgVar2 = L->l_G;
  if (0 < pgVar2->GCdebt) {
    luaC_step(L);
  }
  puVar7 = (undefined8 *)luaM_realloc_(L,(void *)0x0,8,0xe0);
  L1 = (lua_State *)(puVar7 + 2);
  *(byte *)((long)puVar7 + 0x19) = pgVar2->currentwhite & 0x18;
  *(undefined1 *)(puVar7 + 3) = 8;
  puVar7[2] = pgVar2->allgc;
  pgVar2->allgc = (GCObject *)L1;
  pTVar3 = L->top;
  (pTVar3->value_).gc = (GCObject *)L1;
  pTVar3->tt_ = 0x8008;
  if ((*(char *)(puVar7 + 3) != '\b') ||
     ((L != (lua_State *)0x0 &&
      ((*(byte *)((long)puVar7 + 0x19) & (L->l_G->currentwhite ^ 0x18)) != 0)))) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lstate.c"
                  ,0x126,"lua_State *lua_newthread(lua_State *)");
  }
  pTVar3 = L->top;
  L->top = pTVar3 + 1;
  if (L->ci->top < pTVar3 + 1) {
    __assert_fail("(L->top <= L->ci->top) && \"stack overflow\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lstate.c"
                  ,0x127,"lua_State *lua_newthread(lua_State *)");
  }
  puVar7[5] = pgVar2;
  puVar7[9] = 0;
  puVar7[10] = 0;
  puVar7[6] = 0;
  *(undefined4 *)(puVar7 + 0x19) = 0;
  puVar7[0xc] = L1;
  puVar7[0xd] = 0;
  puVar7[0x17] = 0;
  *(undefined8 *)((long)puVar7 + 0xcc) = 0;
  *(undefined8 *)((long)puVar7 + 0xd4) = 0x10000000001;
  *(undefined1 *)((long)puVar7 + 0x1a) = 0;
  puVar7[0x18] = 0;
  *(undefined2 *)((long)puVar7 + 0xb4) = 0;
  *(undefined1 *)((long)puVar7 + 0xb7) = 0x2a;
  *(undefined1 *)((long)puVar7 + 0xdc) = 0x2a;
  *(lu_byte *)(puVar7 + 0x1b) = L->hookmask;
  iVar1 = L->basehookcount;
  *(int *)((long)puVar7 + 0xcc) = iVar1;
  puVar7[0x17] = L->hook;
  *(int *)(puVar7 + 0x1a) = iVar1;
  uVar6 = *(undefined8 *)&pgVar2->mainthread[-1].hookmask;
  *puVar7 = *(undefined8 *)&pgVar2->mainthread[-1].hookcount;
  puVar7[1] = uVar6;
  lVar4._0_1_ = L[-1].hookmask;
  lVar4._1_1_ = L[-1].allowhook;
  lVar4._2_2_ = L[-1].nci;
  lVar4._4_1_ = L[-1].magic;
  lVar4._5_3_ = *(undefined3 *)&L[-1].field_0xcd;
  if (puVar7[1] == lVar4) {
    stack_init(L1,L);
    piVar5 = *(int **)&L[-1].hookmask;
    *piVar5 = *piVar5 + -1;
    if (*piVar5 == 0) {
      return L1;
    }
    __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock) == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lstate.c"
                  ,0x132,"lua_State *lua_newthread(lua_State *)");
  }
  __assert_fail("((struct L_EXTRA*)(((void *)((char *)(L1) - sizeof(struct L_EXTRA)))))->plock == ((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lstate.c"
                ,0x130,"lua_State *lua_newthread(lua_State *)");
}

Assistant:

LUA_API lua_State *lua_newthread (lua_State *L) {
  global_State *g;
  lua_State *L1;
  lua_lock(L);
  g = G(L);
  luaC_checkGC(L);
  /* create new thread */
  L1 = &cast(LX *, luaM_newobject(L, LUA_TTHREAD, sizeof(LX)))->l;
  L1->marked = luaC_white(g);
  L1->tt = LUA_TTHREAD;
  /* link it on list 'allgc' */
  L1->next = g->allgc;
  g->allgc = obj2gco(L1);
  /* anchor it on L stack */
  setthvalue(L, L->top, L1);
  api_incr_top(L);
  preinit_thread(L1, g);
  L1->hookmask = L->hookmask;
  L1->basehookcount = L->basehookcount;
  L1->hook = L->hook;
  resethookcount(L1);
  /* initialize L1 extra space */
  memcpy(lua_getextraspace(L1), lua_getextraspace(g->mainthread),
         LUA_EXTRASPACE);
  luai_userstatethread(L, L1);
  stack_init(L1, L);  /* init stack */
  lua_unlock(L);
  return L1;
}